

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::allgather<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,comm *comm)

{
  datatype dt;
  datatype local_38;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::allgather_big<std::pair<int,double>>(data,size,out,comm);
    return;
  }
  local_38.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  local_38._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
  local_38.builtin = false;
  MPI_Allgather(data,size & 0xffffffff,local_38.mpitype,out,size & 0xffffffff,local_38.mpitype,
                comm->mpi_comm);
  datatype::~datatype(&local_38);
  return;
}

Assistant:

void allgather(const T* data, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        // use custom implementation for big data
        impl::allgather_big(data, size, out, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Allgather(const_cast<T*>(data), size, dt.type(), out, size, dt.type(), comm);
    }
}